

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O3

bool __thiscall jbcoin::STObject::isEquivalent(STObject *this,STBase *t)

{
  bool bVar1;
  STObject *obj2;
  
  obj2 = (STObject *)__dynamic_cast(t,&STBase::typeinfo,&typeinfo,0);
  if (obj2 == (STObject *)0x0) {
    return false;
  }
  if ((this->mType != (SOTemplate *)0x0) && (obj2->mType == this->mType)) {
    bVar1 = equivalentSTObjectSameTemplate(this,obj2);
    return bVar1;
  }
  bVar1 = equivalentSTObject(this,obj2);
  return bVar1;
}

Assistant:

bool STObject::isEquivalent (const STBase& t) const
{
    const STObject* v = dynamic_cast<const STObject*> (&t);

    if (!v)
        return false;

    if (mType != nullptr && (v->mType == mType))
        return equivalentSTObjectSameTemplate (*this, *v);

    return equivalentSTObject (*this, *v);
}